

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::unwind_rparen(jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *this,vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                      *output_stack,error_code *ec)

{
  token_kind tVar1;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ptVar2;
  bool bVar3;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ptVar4;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *__args;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_60;
  
  ptVar4 = (this->operator_stack_).
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __args = (this->operator_stack_).
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__args != ptVar4) {
    tVar1 = __args[-1].type_;
    ptVar2 = __args;
    while (__args = ptVar2, tVar1 != lparen) {
      __args = ptVar2 + -1;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)output_stack,__args);
      ptVar4 = (this->operator_stack_).
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (__args == ptVar4) break;
      tVar1 = ptVar2[-2].type_;
      ptVar2 = __args;
    }
  }
  if (__args != ptVar4) {
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::_M_erase(&this->operator_stack_,__args + -1,
               (this->operator_stack_).
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::is_projection((output_stack->
                            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1);
    if (bVar3) {
      local_60.key_._M_dataplus._M_p = (pointer)&local_60.key_.field_2;
      local_60.type_ = pipe;
      local_60.key_._M_string_length = 0;
      local_60.key_.field_2._M_local_buf[0] = '\0';
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)output_stack,&local_60);
      token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
      ~token(&local_60);
    }
    return;
  }
  std::error_code::operator=(ec,unbalanced_parentheses);
  return;
}

Assistant:

void unwind_rparen(std::vector<token<Json>>& output_stack, std::error_code& ec)
        {
            auto it = operator_stack_.rbegin();
            while (it != operator_stack_.rend() && !(*it).is_lparen())
            {
                output_stack.push_back(std::move(*it));
                ++it;
            }
            if (it == operator_stack_.rend())
            {
                ec = jmespath_errc::unbalanced_parentheses;
                return;
            }
            ++it;
            operator_stack_.erase(it.base(),operator_stack_.end());
            if (output_stack.back().is_projection())
            {
                output_stack.push_back(token<Json>(pipe_arg));
            }
        }